

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O2

void __thiscall LexerTabs::Run(LexerTabs *this)

{
  Test *this_00;
  bool condition;
  Token TVar1;
  string local_70;
  Lexer lexer;
  
  Lexer::Lexer(&lexer,"   \tfoobar");
  TVar1 = Lexer::ReadToken(&lexer);
  testing::Test::Check
            (g_current_test,TVar1 == INDENT,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/lexer_test.cc"
             ,0x5e,"Lexer::INDENT == token");
  TVar1 = Lexer::ReadToken(&lexer);
  testing::Test::Check
            (g_current_test,TVar1 == ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/lexer_test.cc"
             ,0x60,"Lexer::ERROR == token");
  this_00 = g_current_test;
  Lexer::DescribeLastError_abi_cxx11_(&local_70,&lexer);
  condition = std::operator==("tabs are not allowed, use spaces",&local_70);
  testing::Test::Check
            (this_00,condition,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/lexer_test.cc"
             ,0x61,"\"tabs are not allowed, use spaces\" == lexer.DescribeLastError()");
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

TEST(Lexer, Tabs) {
  // Verify we print a useful error on a disallowed character.
  Lexer lexer("   \tfoobar");
  Lexer::Token token = lexer.ReadToken();
  EXPECT_EQ(Lexer::INDENT, token);
  token = lexer.ReadToken();
  EXPECT_EQ(Lexer::ERROR, token);
  EXPECT_EQ("tabs are not allowed, use spaces", lexer.DescribeLastError());
}